

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateMIPSAssembly.cpp
# Opt level: O3

string * getValueOfVarIml(string *__return_storage_ptr__,function *fn,string *varName,
                         string *varName1,Identifier *var,varType type)

{
  pointer pcVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  identifierCategory iVar5;
  varType vVar6;
  Reg RVar7;
  varType vVar8;
  tokenCategory tVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int *piVar15;
  long lVar16;
  const_iterator cVar17;
  undefined8 *puVar18;
  mapped_type *pmVar19;
  long *plVar20;
  mapped_type *pmVar21;
  bool *pbVar22;
  undefined8 uVar23;
  uint uVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  size_type *psVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  ulong uVar29;
  uint uVar30;
  string *psVar31;
  undefined8 uVar32;
  char *pcVar33;
  _Alloc_hider _Var34;
  uint uVar35;
  size_type sVar36;
  size_type sVar37;
  string name0_1;
  string vn_3;
  string name0;
  string realName2;
  string realName;
  stringstream stream2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elements;
  stringstream stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string *local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string local_3f8;
  string *local_3d8;
  varType local_3cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  Identifier *local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  uint auStack_370 [22];
  ios_base local_318 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_3d8 = __return_storage_ptr__;
  local_3cc = type;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar14 = std::__cxx11::string::find((char)varName,0x5b);
  local_420 = varName1;
  if (lVar14 == -1) {
    if ((var->initialized == true) && (iVar5 = Identifier::getIdCategory(var), iVar5 == CONST)) {
      tVar9 = tokenType::getTokenCategory(&var->super_tokenType);
      if (tVar9 != CHARTK) {
        iVar12 = Identifier::getIntValue(var,0);
        std::ostream::operator<<(local_1a8,iVar12);
        std::__cxx11::stringbuf::str();
        goto LAB_0013c15c;
      }
      cVar4 = Identifier::getCharValue(var,0);
      local_398._M_local_buf[0] = cVar4;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_398._M_local_buf,1);
      std::__cxx11::stringbuf::str();
      puVar18 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,0x144540);
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar18 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar18 == paVar25) {
        local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
        local_388._8_8_ = puVar18[3];
        local_398._M_allocated_capacity = (size_type)&local_388;
      }
      else {
        local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
        local_398._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar18;
      }
      local_398._8_8_ = puVar18[1];
      *puVar18 = paVar25;
      puVar18[1] = 0;
      *(undefined1 *)(puVar18 + 2) = 0;
      plVar20 = (long *)std::__cxx11::string::append(local_398._M_local_buf);
      (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
      psVar27 = (size_type *)(plVar20 + 2);
      if ((size_type *)*plVar20 == psVar27) {
        lVar14 = plVar20[3];
        (local_3d8->field_2)._M_allocated_capacity = *psVar27;
        *(long *)((long)&local_3d8->field_2 + 8) = lVar14;
      }
      else {
        (local_3d8->_M_dataplus)._M_p = (pointer)*plVar20;
        (local_3d8->field_2)._M_allocated_capacity = *psVar27;
      }
      local_3d8->_M_string_length = plVar20[1];
      *plVar20 = (long)psVar27;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity != &local_388) {
        operator_delete((void *)local_398._M_allocated_capacity,
                        (ulong)(local_388._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p == &local_460.field_2) goto LAB_0013c15c;
    }
    else {
      pcVar1 = (varName1->_M_dataplus)._M_p;
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_460,pcVar1,pcVar1 + varName1->_M_string_length);
      _Var34._M_p = local_460._M_dataplus._M_p;
      if (local_460._M_string_length != 0) {
        sVar36 = 0;
        do {
          iVar12 = tolower((int)_Var34._M_p[sVar36]);
          _Var34._M_p[sVar36] = (char)iVar12;
          sVar36 = sVar36 + 1;
        } while (local_460._M_string_length != sVar36);
      }
      psVar31 = local_420;
      bVar3 = function::varHasReg(fn,local_420);
      if (bVar3) {
        local_398._M_allocated_capacity._0_4_ = function::getRegOfVar(fn,psVar31,true);
        pmVar21 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&local_398._M_allocated_capacity);
        (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
        pcVar1 = (pmVar21->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,pcVar1,pcVar1 + pmVar21->_M_string_length);
      }
      else {
        bVar3 = function::stackHasVar(fn,psVar31);
        if (!bVar3) {
          cVar17 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::find(&var2mem_abi_cxx11_._M_t,&local_460);
          if ((_Rb_tree_header *)cVar17._M_node ==
              &var2mem_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
            vVar6 = whatIsThisShit(psVar31,fn);
            variableArrangeSpace(fn,psVar31,vVar6);
            bVar3 = function::varHasReg(fn,psVar31);
            if (bVar3) {
              local_398._M_allocated_capacity._0_4_ = function::getRegOfVar(fn,psVar31,false);
              pmVar21 = std::
                        map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(&reg2str_abi_cxx11_,(key_type *)&local_398._M_allocated_capacity);
              (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
              pcVar1 = (pmVar21->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3d8,pcVar1,pcVar1 + pmVar21->_M_string_length);
            }
            else {
              iVar12 = function::getOffSet(fn,psVar31);
              std::__cxx11::to_string(&local_4a0,iVar12);
              std::operator+(&local_3f8,"lw $t9 ",&local_4a0);
              puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
              paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar18 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar18 == paVar25) {
                local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
                local_388._8_8_ = puVar18[3];
                local_398._M_allocated_capacity = (size_type)&local_388;
              }
              else {
                local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
                local_398._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar18;
              }
              local_398._8_8_ = puVar18[1];
              *puVar18 = paVar25;
              puVar18[1] = 0;
              *(undefined1 *)(puVar18 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_398);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_allocated_capacity != &local_388) {
                operator_delete((void *)local_398._M_allocated_capacity,
                                (ulong)(local_388._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                operator_delete(local_4a0._M_dataplus._M_p,
                                (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
              }
              local_398._M_allocated_capacity._0_4_ = 0x19;
              pmVar21 = std::
                        map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(&reg2str_abi_cxx11_,(key_type *)&local_398._M_allocated_capacity);
              (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
              pcVar1 = (pmVar21->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3d8,pcVar1,pcVar1 + pmVar21->_M_string_length);
            }
            goto LAB_00139920;
          }
        }
        bVar3 = function::stackHasVar(fn,psVar31);
        if (bVar3) {
          uVar11 = function::getOffSet(fn,psVar31);
          uVar35 = -uVar11;
          if (0 < (int)uVar11) {
            uVar35 = uVar11;
          }
          uVar30 = 1;
          if (9 < uVar35) {
            uVar29 = (ulong)uVar35;
            uVar2 = 4;
            do {
              uVar30 = uVar2;
              uVar24 = (uint)uVar29;
              if (uVar24 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_00139784;
              }
              if (uVar24 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_00139784;
              }
              if (uVar24 < 10000) goto LAB_00139784;
              uVar29 = uVar29 / 10000;
              uVar2 = uVar30 + 4;
            } while (99999 < uVar24);
            uVar30 = uVar30 + 1;
          }
LAB_00139784:
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_4a0,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_4a0._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
          plVar20 = (long *)std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,0x1449f9);
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar20 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar20 == paVar25) {
            local_3f8.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_3f8.field_2._8_8_ = plVar20[3];
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          }
          else {
            local_3f8.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_3f8._M_dataplus._M_p = (pointer)*plVar20;
          }
          local_3f8._M_string_length = plVar20[1];
          *plVar20 = (long)paVar25;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar25) {
            local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_388._8_8_ = puVar18[3];
            local_398._M_allocated_capacity = (size_type)&local_388;
          }
          else {
            local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_398._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar18;
          }
          local_398._8_8_ = puVar18[1];
          *puVar18 = paVar25;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            (ulong)(local_388._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_398._M_local_buf);
          pcVar1 = (varName->_M_dataplus)._M_p;
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3f8,pcVar1,pcVar1 + varName->_M_string_length);
          sVar36 = local_3f8._M_string_length;
          _Var34._M_p = local_3f8._M_dataplus._M_p;
          if (local_3f8._M_string_length != 0) {
            lVar14 = 0;
            do {
              iVar12 = tolower((int)_Var34._M_p[lVar14]);
              _Var34._M_p[lVar14] = (char)iVar12;
              lVar14 = lVar14 + 1;
            } while (sVar36 != lVar14);
          }
          pmVar19 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,&local_3f8);
          iVar12 = *pmVar19;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_388._M_local_buf,"0x",2);
          *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
               *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
               0xffffffb5 | 8;
          std::ostream::operator<<((ostream *)local_388._M_local_buf,iVar12);
          std::__cxx11::stringbuf::str();
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,0x1449f9);
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar25) {
            local_4a0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_4a0.field_2._8_8_ = puVar18[3];
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          }
          else {
            local_4a0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_4a0._M_dataplus._M_p = (pointer)*puVar18;
          }
          local_4a0._M_string_length = puVar18[1];
          *puVar18 = paVar25;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&local_4a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_398._M_local_buf);
          std::ios_base::~ios_base(local_318);
        }
        local_398._M_allocated_capacity._0_4_ = 0x19;
        pmVar21 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&local_398._M_allocated_capacity);
        (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
        pcVar1 = (pmVar21->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,pcVar1,pcVar1 + pmVar21->_M_string_length);
      }
LAB_00139920:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p == &local_460.field_2) goto LAB_0013c15c;
    }
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    goto LAB_0013c15c;
  }
  uVar32 = &local_1d8.field_2;
  pcVar1 = (varName->_M_dataplus)._M_p;
  local_1d8._M_dataplus._M_p = (pointer)uVar32;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar1,pcVar1 + varName->_M_string_length);
  boomVec(&local_210,&local_1d8);
  if (local_1d8._M_dataplus._M_p != (pointer)uVar32) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((long)local_210.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_210.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    if ((local_210.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
LAB_0013c1a7:
      uVar32 = 0;
      pcVar33 = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
      uVar29 = 0;
      goto LAB_0013c1b4;
    }
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    if (9 < (int)paVar25->_M_local_buf[0] - 0x30U) {
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      pcVar1 = ((local_210.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_460,pcVar1,
                 pcVar1 + (local_210.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      getRealName(&local_3f8,&local_460,'[');
      vVar6 = whatIsThisShit(&local_3f8,fn);
      if (vVar6 == TEMP_VAR) {
        bVar3 = function::varHasReg(fn,&local_460);
        if (bVar3) {
          local_440._M_dataplus._M_p._0_4_ = function::getRegOfVar(fn,&local_460,true);
          pmVar21 = std::
                    map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at(&reg2str_abi_cxx11_,(key_type *)&local_440);
          std::operator+(&local_4a0,"sll $t8 ",pmVar21);
          puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar25) {
            local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_388._8_8_ = puVar18[3];
            local_398._M_allocated_capacity = (size_type)&local_388;
          }
          else {
            local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_398._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar18;
          }
          local_398._8_8_ = puVar18[1];
          *puVar18 = paVar25;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            (ulong)(local_388._M_allocated_capacity + 1));
          }
          psVar31 = local_420;
          uVar32 = local_4a0.field_2._M_allocated_capacity;
          uVar23 = local_4a0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
LAB_0013a818:
            operator_delete((void *)uVar23,(ulong)(uVar32 + 1));
          }
        }
        else {
          uVar30 = 1;
          uVar11 = function::getOffsetOfTemp(fn,&local_460,true);
          uVar35 = -uVar11;
          if (0 < (int)uVar11) {
            uVar35 = uVar11;
          }
          if (9 < uVar35) {
            uVar29 = (ulong)uVar35;
            uVar2 = 4;
            do {
              uVar30 = uVar2;
              uVar24 = (uint)uVar29;
              if (uVar24 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0013a5a7;
              }
              if (uVar24 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0013a5a7;
              }
              if (uVar24 < 10000) goto LAB_0013a5a7;
              uVar29 = uVar29 / 10000;
              uVar2 = uVar30 + 4;
            } while (99999 < uVar24);
            uVar30 = uVar30 + 1;
          }
LAB_0013a5a7:
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_440,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_440._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,0x1449bf);
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar25) {
            local_4a0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_4a0.field_2._8_8_ = puVar18[3];
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          }
          else {
            local_4a0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_4a0._M_dataplus._M_p = (pointer)*puVar18;
          }
          local_4a0._M_string_length = puVar18[1];
          *puVar18 = paVar25;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar25) {
            local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_388._8_8_ = puVar18[3];
            local_398._M_allocated_capacity = (size_type)&local_388;
          }
          else {
            local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_398._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar18;
          }
          local_398._8_8_ = puVar18[1];
          *puVar18 = paVar25;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            (ulong)(local_388._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[14]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
          psVar31 = local_420;
        }
      }
      else {
        getValueOfVar((string *)&local_398,&local_460,fn);
        vVar6 = whatIsThisShit((string *)&local_398,fn);
        uVar23 = local_398._M_allocated_capacity;
        if (vVar6 != TEMP_VAR) {
          piVar15 = __errno_location();
          iVar12 = *piVar15;
          *piVar15 = 0;
          lVar14 = strtol((char *)uVar23,(char **)&local_480,10);
          if (local_480._M_dataplus._M_p == (pointer)uVar23) {
LAB_0013c27e:
            std::__throw_invalid_argument("stoi");
          }
          else {
            iVar10 = (int)lVar14;
            if ((iVar10 == lVar14) && (*piVar15 != 0x22)) {
              if (*piVar15 == 0) {
                *piVar15 = iVar12;
              }
              uVar11 = iVar10 * 4;
              uVar35 = iVar10 * -4;
              if (iVar10 * -4 < 0) {
                uVar35 = uVar11;
              }
              uVar30 = 1;
              if (9 < uVar35) {
                uVar29 = (ulong)uVar35;
                uVar2 = 4;
                do {
                  uVar30 = uVar2;
                  uVar24 = (uint)uVar29;
                  if (uVar24 < 100) {
                    uVar30 = uVar30 - 2;
                    goto LAB_0013a720;
                  }
                  if (uVar24 < 1000) {
                    uVar30 = uVar30 - 1;
                    goto LAB_0013a720;
                  }
                  if (uVar24 < 10000) goto LAB_0013a720;
                  uVar29 = uVar29 / 10000;
                  uVar2 = uVar30 + 4;
                } while (99999 < uVar24);
                uVar30 = uVar30 + 1;
              }
LAB_0013a720:
              local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_440,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_440._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
              puVar18 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,0x144966);
              paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar18 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar18 == paVar25) {
                local_4a0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
                local_4a0.field_2._8_8_ = puVar18[3];
                local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
              }
              else {
                local_4a0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
                local_4a0._M_dataplus._M_p = (pointer)*puVar18;
              }
              local_4a0._M_string_length = puVar18[1];
              *puVar18 = paVar25;
              puVar18[1] = 0;
              *(undefined1 *)(puVar18 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,&local_4a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                operator_delete(local_4a0._M_dataplus._M_p,
                                (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
              }
              psVar31 = local_420;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p != &local_440.field_2) {
                operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
                psVar31 = local_420;
              }
              goto LAB_0013a7ff;
            }
          }
          std::__throw_out_of_range("stoi");
LAB_0013c296:
          std::__throw_invalid_argument("stoi");
LAB_0013c2a2:
          std::__throw_out_of_range("stoi");
LAB_0013c2ae:
          std::__throw_invalid_argument("stoi");
LAB_0013c2ba:
          uVar23 = std::__throw_out_of_range("stoi");
          if (local_398._M_allocated_capacity != uVar32) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            (ulong)(local_388._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          if ((function *)local_460._M_dataplus._M_p != fn) {
            operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_138);
          _Unwind_Resume(uVar23);
        }
        std::operator+(&local_440,"sll $t8 ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_398);
        puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar18 == paVar25) {
          local_4a0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_4a0.field_2._8_8_ = puVar18[3];
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        }
        else {
          local_4a0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_4a0._M_dataplus._M_p = (pointer)*puVar18;
        }
        local_4a0._M_string_length = puVar18[1];
        *puVar18 = paVar25;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&local_4a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
        psVar31 = local_420;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
        }
LAB_0013a7ff:
        uVar32 = local_388._M_allocated_capacity;
        uVar23 = local_398._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) goto LAB_0013a818;
      }
      if (local_3cc == LOCAL_VAR) {
        uVar11 = function::getOffSet(fn,psVar31);
        uVar35 = -uVar11;
        if (0 < (int)uVar11) {
          uVar35 = uVar11;
        }
        uVar30 = 1;
        if (9 < uVar35) {
          uVar29 = (ulong)uVar35;
          uVar2 = 4;
          do {
            uVar30 = uVar2;
            uVar24 = (uint)uVar29;
            if (uVar24 < 100) {
              uVar30 = uVar30 - 2;
              goto LAB_0013aa51;
            }
            if (uVar24 < 1000) {
              uVar30 = uVar30 - 1;
              goto LAB_0013aa51;
            }
            if (uVar24 < 10000) goto LAB_0013aa51;
            uVar29 = uVar29 / 10000;
            uVar2 = uVar30 + 4;
          } while (99999 < uVar24);
          uVar30 = uVar30 + 1;
        }
LAB_0013aa51:
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_4a0,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_4a0._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,0x14497c);
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar18 == paVar25) {
          local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_388._8_8_ = puVar18[3];
          local_398._M_allocated_capacity = (size_type)&local_388;
        }
        else {
          local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_398._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar18;
        }
        local_398._8_8_ = puVar18[1];
        *puVar18 = paVar25;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) {
          operator_delete((void *)local_398._M_allocated_capacity,
                          (ulong)(local_388._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)local_398._M_local_buf);
        pcVar1 = (psVar31->_M_dataplus)._M_p;
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4a0,pcVar1,pcVar1 + psVar31->_M_string_length);
        sVar36 = local_4a0._M_string_length;
        _Var34._M_p = local_4a0._M_dataplus._M_p;
        if (local_4a0._M_string_length != 0) {
          sVar37 = 0;
          do {
            iVar12 = tolower((int)_Var34._M_p[sVar37]);
            _Var34._M_p[sVar37] = (char)iVar12;
            sVar37 = sVar37 + 1;
          } while (sVar36 != sVar37);
        }
        pmVar19 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(&var2mem_abi_cxx11_,&local_4a0);
        iVar12 = *pmVar19;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388._M_local_buf,"0x",2)
        ;
        *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
             0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)local_388._M_local_buf,iVar12);
        std::__cxx11::stringbuf::str();
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,0x14497c);
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar18 == paVar25) {
          local_440.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_440.field_2._8_8_ = puVar18[3];
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        }
        else {
          local_440.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_440._M_dataplus._M_p = (pointer)*puVar18;
        }
        local_440._M_string_length = puVar18[1];
        *puVar18 = paVar25;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&local_440);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_398._M_local_buf);
        std::ios_base::~ios_base(local_318);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[13]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
      local_398._M_allocated_capacity._0_4_ = 0x19;
      pmVar21 = std::
                map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::at(&reg2str_abi_cxx11_,(key_type *)&local_398._M_allocated_capacity);
      (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
      pcVar1 = (pmVar21->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3d8,pcVar1,pcVar1 + pmVar21->_M_string_length);
LAB_0013c11e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
LAB_0013c142:
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      }
LAB_0013c14f:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_210);
LAB_0013c15c:
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return local_3d8;
    }
    piVar15 = __errno_location();
    iVar12 = *piVar15;
    *piVar15 = 0;
    lVar14 = strtol(paVar25->_M_local_buf,(char **)&local_398._M_allocated_capacity,10);
    psVar31 = local_420;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_allocated_capacity == paVar25) {
      std::__throw_invalid_argument("stoi");
    }
    else {
      uVar35 = (uint)lVar14;
      if (((int)uVar35 == lVar14) && (*piVar15 != 0x22)) {
        if (*piVar15 == 0) {
          *piVar15 = iVar12;
        }
        uVar11 = -uVar35;
        if (0 < (int)uVar35) {
          uVar11 = uVar35;
        }
        uVar30 = 1;
        if (9 < uVar11) {
          uVar29 = (ulong)uVar11;
          uVar2 = 4;
          do {
            uVar30 = uVar2;
            uVar24 = (uint)uVar29;
            if (uVar24 < 100) {
              uVar30 = uVar30 - 2;
              goto LAB_00138a42;
            }
            if (uVar24 < 1000) {
              uVar30 = uVar30 - 1;
              goto LAB_00138a42;
            }
            if (uVar24 < 10000) goto LAB_00138a42;
            uVar29 = uVar29 / 10000;
            uVar2 = uVar30 + 4;
          } while (99999 < uVar24);
          uVar30 = uVar30 + 1;
        }
LAB_00138a42:
        paVar25 = &local_460.field_2;
        local_460._M_dataplus._M_p = (pointer)paVar25;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_460,(char)uVar30 - ((char)((ulong)lVar14 >> 0x18) >> 7));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_460._M_dataplus._M_p + (uVar35 >> 0x1f),uVar30,uVar11);
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,0x144966);
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar18 == paVar26) {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_388._8_8_ = puVar18[3];
          local_398._M_allocated_capacity = (size_type)&local_388;
        }
        else {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_398._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar18;
        }
        local_398._8_8_ = puVar18[1];
        *puVar18 = paVar26;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) {
          operator_delete((void *)local_398._M_allocated_capacity,
                          (ulong)(local_388._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != paVar25) {
          operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[14]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
        if (local_3cc == LOCAL_VAR) {
          uVar11 = function::getOffSet(fn,psVar31);
          uVar35 = -uVar11;
          if (0 < (int)uVar11) {
            uVar35 = uVar11;
          }
          uVar30 = 1;
          if (9 < uVar35) {
            uVar29 = (ulong)uVar35;
            uVar2 = 4;
            do {
              uVar30 = uVar2;
              uVar24 = (uint)uVar29;
              if (uVar24 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_001392f1;
              }
              if (uVar24 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_001392f1;
              }
              if (uVar24 < 10000) goto LAB_001392f1;
              uVar29 = uVar29 / 10000;
              uVar2 = uVar30 + 4;
            } while (99999 < uVar24);
            uVar30 = uVar30 + 1;
          }
LAB_001392f1:
          local_460._M_dataplus._M_p = (pointer)paVar25;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_460,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_460._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,0x14497c);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar26) {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_388._8_8_ = puVar18[3];
            local_398._M_allocated_capacity = (size_type)&local_388;
          }
          else {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_398._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar18;
          }
          local_398._8_8_ = puVar18[1];
          *puVar18 = paVar26;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            (ulong)(local_388._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != paVar25) {
            operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_398._M_local_buf);
          pcVar1 = (psVar31->_M_dataplus)._M_p;
          local_460._M_dataplus._M_p = (pointer)paVar25;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_460,pcVar1,pcVar1 + psVar31->_M_string_length);
          _Var34._M_p = local_460._M_dataplus._M_p;
          if (local_460._M_string_length != 0) {
            sVar36 = 0;
            do {
              iVar12 = tolower((int)_Var34._M_p[sVar36]);
              _Var34._M_p[sVar36] = (char)iVar12;
              sVar36 = sVar36 + 1;
            } while (local_460._M_string_length != sVar36);
          }
          pmVar19 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,&local_460);
          iVar12 = *pmVar19;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_388._M_local_buf,"0x",2);
          *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
               *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
               0xffffffb5 | 8;
          std::ostream::operator<<((ostream *)local_388._M_local_buf,iVar12);
          std::__cxx11::stringbuf::str();
          plVar20 = (long *)std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,0x14497c);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar20 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar20 == paVar26) {
            local_3f8.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_3f8.field_2._8_8_ = plVar20[3];
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          }
          else {
            local_3f8.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_3f8._M_dataplus._M_p = (pointer)*plVar20;
          }
          local_3f8._M_string_length = plVar20[1];
          *plVar20 = (long)paVar26;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&local_3f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != paVar25) {
            operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_398._M_local_buf);
          std::ios_base::~ios_base(local_318);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
        local_398._M_allocated_capacity._0_4_ = 0x19;
        pmVar21 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&local_398._M_allocated_capacity);
        (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
        pcVar1 = (pmVar21->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,pcVar1,pcVar1 + pmVar21->_M_string_length);
        goto LAB_0013c14f;
      }
    }
    std::__throw_out_of_range("stoi");
LAB_0013c1d3:
    std::__throw_invalid_argument("stoi");
LAB_0013c1df:
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar29 = (long)local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    pcVar33 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
    if (local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar32 = 0;
      goto LAB_0013c1b4;
    }
    if ((local_210.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) goto LAB_0013c1a7;
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    if (9 < (int)paVar25->_M_local_buf[0] - 0x30U) {
      if (uVar29 < 2) goto LAB_0013c1af;
      if (local_210.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) goto LAB_0013c1a7;
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      if (9 < (int)paVar25->_M_local_buf[0] - 0x30U) {
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        pcVar1 = ((local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_460,pcVar1,
                   pcVar1 + (local_210.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        if ((ulong)((long)local_210.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_210.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_0013c1f7;
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        pcVar1 = local_210.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f8,pcVar1,
                   pcVar1 + local_210.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        getRealName(&local_4a0,&local_460,'[');
        getRealName(&local_440,&local_3f8,'[');
        vVar8 = whatIsThisShit(&local_4a0,fn);
        vVar6 = whatIsThisShit(&local_440,fn);
        if (vVar8 == TEMP_VAR) {
          bVar3 = function::varHasReg(fn,&local_460);
          if (bVar3) {
            RVar7 = function::getRegOfVar(fn,&local_460,true);
            local_1f8._M_allocated_capacity._0_4_ = RVar7;
            pmVar21 = std::
                      map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::at(&reg2str_abi_cxx11_,(key_type *)&local_1f8._M_allocated_capacity);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_418,"mul $t8 ",pmVar21);
            puVar18 = (undefined8 *)std::__cxx11::string::append(local_418._M_local_buf);
            paVar25 = &local_480.field_2;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            local_3a0 = (Identifier *)CONCAT44(local_3a0._4_4_,vVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar26) {
              local_480.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_480.field_2._8_8_ = puVar18[3];
              local_480._M_dataplus._M_p = (pointer)paVar25;
            }
            else {
              local_480.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_480._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_480._M_string_length = puVar18[1];
            *puVar18 = paVar26;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            uVar11 = Identifier::getDimension(var,2);
            uVar35 = -uVar11;
            if (0 < (int)uVar11) {
              uVar35 = uVar11;
            }
            uVar30 = 1;
            if (9 < uVar35) {
              uVar29 = (ulong)uVar35;
              uVar2 = 4;
              do {
                uVar30 = uVar2;
                uVar24 = (uint)uVar29;
                if (uVar24 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_0013b497;
                }
                if (uVar24 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_0013b497;
                }
                if (uVar24 < 10000) goto LAB_0013b497;
                uVar29 = uVar29 / 10000;
                uVar2 = uVar30 + 4;
              } while (99999 < uVar24);
              uVar30 = uVar30 + 1;
            }
LAB_0013b497:
            local_3c0._M_allocated_capacity = (size_type)&local_3b0;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_3c0,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_3c0._M_allocated_capacity + (uVar11 >> 0x1f)),uVar30,uVar35);
            uVar32 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != paVar25) {
              uVar32 = local_480.field_2._0_8_;
            }
            if ((ulong)uVar32 < (char *)(local_3c0._8_8_ + local_480._M_string_length)) {
              uVar32 = (char *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._M_allocated_capacity != &local_3b0) {
                uVar32 = local_3b0._M_allocated_capacity;
              }
              if ((ulong)uVar32 < (char *)(local_3c0._8_8_ + local_480._M_string_length))
              goto LAB_0013b51d;
              puVar18 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_3c0,0,(char *)0x0,(ulong)local_480._M_dataplus._M_p
                                  );
            }
            else {
LAB_0013b51d:
              puVar18 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_480,local_3c0._M_allocated_capacity);
            }
            local_398._M_allocated_capacity = (size_type)&local_388;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar26) {
              local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_388._8_8_ = puVar18[3];
            }
            else {
              local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_398._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar18;
            }
            local_398._8_8_ = puVar18[1];
            *puVar18 = paVar26;
            puVar18[1] = 0;
            paVar26->_M_local_buf[0] = '\0';
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity != &local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,
                              (ulong)(local_388._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_allocated_capacity != &local_3b0) {
              operator_delete((void *)local_3c0._M_allocated_capacity,
                              (ulong)(local_3b0._M_allocated_capacity + 1));
            }
            vVar6 = (varType)local_3a0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != paVar25) {
              operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
            }
            psVar31 = local_420;
            uVar32 = local_408._M_allocated_capacity;
            uVar23 = local_418._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_allocated_capacity != &local_408) goto LAB_0013b623;
          }
          else {
            uVar30 = 1;
            local_3c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)fn;
            uVar11 = function::getOffsetOfTemp(fn,&local_460,true);
            uVar35 = -uVar11;
            if (0 < (int)uVar11) {
              uVar35 = uVar11;
            }
            if (9 < uVar35) {
              uVar29 = (ulong)uVar35;
              uVar2 = 4;
              do {
                uVar30 = uVar2;
                uVar24 = (uint)uVar29;
                if (uVar24 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_0013b004;
                }
                if (uVar24 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_0013b004;
                }
                if (uVar24 < 10000) goto LAB_0013b004;
                uVar29 = uVar29 / 10000;
                uVar2 = uVar30 + 4;
              } while (99999 < uVar24);
              uVar30 = uVar30 + 1;
            }
LAB_0013b004:
            local_418._M_allocated_capacity = (size_type)&local_408;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_418,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((uVar11 >> 0x1f) + local_418._M_allocated_capacity),uVar30,uVar35);
            puVar18 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,0x1449bf);
            paVar25 = &local_480.field_2;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar26) {
              local_480.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_480.field_2._8_8_ = puVar18[3];
              local_480._M_dataplus._M_p = (pointer)paVar25;
            }
            else {
              local_480.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_480._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_480._M_string_length = puVar18[1];
            *puVar18 = paVar26;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_480);
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar26) {
              local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_388._8_8_ = puVar18[3];
              local_398._M_allocated_capacity = (size_type)&local_388;
            }
            else {
              local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_398._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar18;
            }
            local_398._8_8_ = puVar18[1];
            *puVar18 = paVar26;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity != &local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,
                              (ulong)(local_388._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != paVar25) {
              operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_allocated_capacity != &local_408) {
              operator_delete((void *)local_418._M_allocated_capacity,
                              (ulong)(local_408._M_allocated_capacity + 1));
            }
            uVar11 = Identifier::getDimension(var,2);
            uVar35 = -uVar11;
            if (0 < (int)uVar11) {
              uVar35 = uVar11;
            }
            uVar30 = 1;
            if (9 < uVar35) {
              uVar29 = (ulong)uVar35;
              uVar2 = 4;
              do {
                uVar30 = uVar2;
                uVar24 = (uint)uVar29;
                if (uVar24 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_0013b633;
                }
                if (uVar24 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_0013b633;
                }
                if (uVar24 < 10000) goto LAB_0013b633;
                uVar29 = uVar29 / 10000;
                uVar2 = uVar30 + 4;
              } while (99999 < uVar24);
              uVar30 = uVar30 + 1;
            }
LAB_0013b633:
            local_480._M_dataplus._M_p = (pointer)paVar25;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_480,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_480._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
            puVar18 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,0x1449d0);
            fn = (function *)local_3c8;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar26) {
              local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_388._8_8_ = puVar18[3];
              local_398._M_allocated_capacity = (size_type)&local_388;
            }
            else {
              local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_398._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar18;
            }
            local_398._8_8_ = puVar18[1];
            *puVar18 = paVar26;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity != &local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,
                              (ulong)(local_388._M_allocated_capacity + 1));
            }
            psVar31 = local_420;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != paVar25) {
              operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
              psVar31 = local_420;
            }
          }
        }
        else {
          getValueOfVar((string *)&local_398,&local_460,fn);
          vVar8 = whatIsThisShit((string *)&local_398,fn);
          uVar32 = local_398._M_allocated_capacity;
          local_3a0 = (Identifier *)CONCAT44(local_3a0._4_4_,vVar6);
          if (vVar8 == TEMP_VAR) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_3c0,"mul $t8 ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398);
            puVar18 = (undefined8 *)std::__cxx11::string::append(local_3c0._M_local_buf);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar25) {
              local_408._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_408._8_8_ = puVar18[3];
              local_418._M_allocated_capacity = (size_type)&local_408;
            }
            else {
              local_408._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_418._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar18;
            }
            local_418._8_8_ = puVar18[1];
            *puVar18 = paVar25;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            uVar11 = Identifier::getDimension(var,2);
            uVar35 = -uVar11;
            if (0 < (int)uVar11) {
              uVar35 = uVar11;
            }
            uVar30 = 1;
            if (9 < uVar35) {
              uVar29 = (ulong)uVar35;
              uVar2 = 4;
              do {
                uVar30 = uVar2;
                uVar24 = (uint)uVar29;
                if (uVar24 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_0013b2e6;
                }
                if (uVar24 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_0013b2e6;
                }
                if (uVar24 < 10000) goto LAB_0013b2e6;
                uVar29 = uVar29 / 10000;
                uVar2 = uVar30 + 4;
              } while (99999 < uVar24);
              uVar30 = uVar30 + 1;
            }
LAB_0013b2e6:
            local_1f8._M_allocated_capacity = (size_type)&local_1e8;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_1f8,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_1f8._M_allocated_capacity + (uVar11 >> 0x1f)),uVar30,uVar35);
            uVar32 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_allocated_capacity != &local_408) {
              uVar32 = local_408._M_allocated_capacity;
            }
            if ((ulong)uVar32 < (char *)(local_1f8._8_8_ + local_418._8_8_)) {
              uVar32 = (char *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_allocated_capacity != &local_1e8) {
                uVar32 = local_1e8._M_allocated_capacity;
              }
              if ((ulong)uVar32 < (char *)(local_1f8._8_8_ + local_418._8_8_)) goto LAB_0013b375;
              puVar18 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_1f8,0,(char *)0x0,local_418._M_allocated_capacity);
            }
            else {
LAB_0013b375:
              puVar18 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  (local_418._M_local_buf,local_1f8._M_allocated_capacity);
            }
            local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar25) {
              local_480.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_480.field_2._8_8_ = puVar18[3];
            }
            else {
              local_480.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_480._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_480._M_string_length = puVar18[1];
            *puVar18 = paVar25;
            puVar18[1] = 0;
            paVar25->_M_local_buf[0] = '\0';
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&local_480);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_allocated_capacity != &local_1e8) {
              operator_delete((void *)local_1f8._M_allocated_capacity,
                              (ulong)(local_1e8._M_allocated_capacity + 1));
            }
            vVar6 = (varType)local_3a0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_allocated_capacity != &local_408) {
              operator_delete((void *)local_418._M_allocated_capacity,
                              (ulong)(local_408._M_allocated_capacity + 1));
            }
            psVar31 = local_420;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_allocated_capacity != &local_3b0) {
              operator_delete((void *)local_3c0._M_allocated_capacity,
                              (ulong)(local_3b0._M_allocated_capacity + 1));
            }
          }
          else {
            local_3c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)fn;
            piVar15 = __errno_location();
            iVar12 = *piVar15;
            *piVar15 = 0;
            fn = (function *)&local_3c0;
            lVar14 = strtol((char *)uVar32,(char **)fn,10);
            if (local_3c0._M_allocated_capacity == uVar32) goto LAB_0013c296;
            if (((int)lVar14 != lVar14) || (*piVar15 == 0x22)) goto LAB_0013c2a2;
            if (*piVar15 == 0) {
              *piVar15 = iVar12;
            }
            iVar12 = Identifier::getDimension(var,2);
            uVar11 = iVar12 * (int)lVar14;
            uVar35 = -uVar11;
            if (0 < (int)uVar11) {
              uVar35 = uVar11;
            }
            uVar30 = 1;
            if (9 < uVar35) {
              uVar29 = (ulong)uVar35;
              uVar2 = 4;
              do {
                uVar30 = uVar2;
                uVar24 = (uint)uVar29;
                if (uVar24 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_0013b1e7;
                }
                if (uVar24 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_0013b1e7;
                }
                if (uVar24 < 10000) goto LAB_0013b1e7;
                uVar29 = uVar29 / 10000;
                uVar2 = uVar30 + 4;
              } while (99999 < uVar24);
              uVar30 = uVar30 + 1;
            }
LAB_0013b1e7:
            local_418._M_allocated_capacity = (size_type)&local_408;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_418,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((uVar11 >> 0x1f) + local_418._M_allocated_capacity),uVar30,uVar35);
            puVar18 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,0x144966);
            fn = (function *)local_3c8;
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar25) {
              local_480.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_480.field_2._8_8_ = puVar18[3];
              local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
            }
            else {
              local_480.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_480._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_480._M_string_length = puVar18[1];
            *puVar18 = paVar25;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&local_480);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
            }
            psVar31 = local_420;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_allocated_capacity != &local_408) {
              operator_delete((void *)local_418._M_allocated_capacity,
                              (ulong)(local_408._M_allocated_capacity + 1));
            }
            vVar6 = (varType)local_3a0;
          }
          uVar32 = local_388._M_allocated_capacity;
          uVar23 = local_398._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity == &local_388) goto LAB_0013b71e;
LAB_0013b623:
          operator_delete((void *)uVar23,(ulong)(uVar32 + 1));
        }
LAB_0013b71e:
        if (vVar6 == TEMP_VAR) {
          bVar3 = function::varHasReg(fn,&local_3f8);
          if (bVar3) {
            RVar7 = function::getRegOfVar(fn,&local_3f8,true);
            local_480._M_dataplus._M_p._0_4_ = RVar7;
            pmVar21 = std::
                      map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::at(&reg2str_abi_cxx11_,(key_type *)&local_480);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,"addu $t8 $t8 ",pmVar21);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity != &local_388) goto LAB_0013bd13;
          }
          else {
            uVar30 = 1;
            uVar11 = function::getOffsetOfTemp(fn,&local_3f8,true);
            uVar35 = -uVar11;
            if (0 < (int)uVar11) {
              uVar35 = uVar11;
            }
            if (9 < uVar35) {
              uVar29 = (ulong)uVar35;
              uVar2 = 4;
              do {
                uVar30 = uVar2;
                uVar24 = (uint)uVar29;
                if (uVar24 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_0013ba61;
                }
                if (uVar24 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_0013ba61;
                }
                if (uVar24 < 10000) goto LAB_0013ba61;
                uVar29 = uVar29 / 10000;
                uVar2 = uVar30 + 4;
              } while (99999 < uVar24);
              uVar30 = uVar30 + 1;
            }
LAB_0013ba61:
            local_418._M_allocated_capacity = (size_type)&local_408;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_418,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((uVar11 >> 0x1f) + local_418._M_allocated_capacity),uVar30,uVar35);
            puVar18 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,0x1449f9);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar25) {
              local_480.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_480.field_2._8_8_ = puVar18[3];
              local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
            }
            else {
              local_480.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_480._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_480._M_string_length = puVar18[1];
            *puVar18 = paVar25;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_480);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar25) {
              local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_388._8_8_ = puVar18[3];
              local_398._M_allocated_capacity = (size_type)&local_388;
            }
            else {
              local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_398._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar18;
            }
            local_398._8_8_ = puVar18[1];
            *puVar18 = paVar25;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity != &local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,
                              (ulong)(local_388._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_allocated_capacity != &local_408) {
              operator_delete((void *)local_418._M_allocated_capacity,
                              (ulong)(local_408._M_allocated_capacity + 1));
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[17]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $t9");
            psVar31 = local_420;
          }
        }
        else {
          local_398._M_allocated_capacity = (size_type)&local_388;
          local_398._8_8_ = (char *)0x0;
          local_388._M_allocated_capacity = local_388._M_allocated_capacity & 0xffffffffffffff00;
          if (v1 == false) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[13]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [13])"la $v1 ($t8)");
            std::__cxx11::string::_M_replace((ulong)&local_398,0,(char *)local_398._8_8_,0x14487b);
            pbVar22 = &v1;
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[13]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [13])"la $s7 ($t8)");
            std::__cxx11::string::_M_replace((ulong)&local_398,0,(char *)local_398._8_8_,0x1448cb);
            pbVar22 = &s7;
          }
          *pbVar22 = true;
          getValueOfVar(&local_480,&local_3f8,fn);
          iVar12 = std::__cxx11::string::compare(local_398._M_local_buf);
          if (iVar12 == 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[13]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [13])"la $t8 ($v1)");
            pbVar22 = &v1;
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[13]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [13])"la $t8 ($s7)");
            pbVar22 = &s7;
          }
          *pbVar22 = false;
          vVar6 = whatIsThisShit(&local_480,fn);
          _Var34._M_p = local_480._M_dataplus._M_p;
          if (vVar6 == TEMP_VAR) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_418,"addu $t8 $t8 ",&local_480);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_418);
            uVar32 = local_408._M_allocated_capacity;
            uVar23 = local_418._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_allocated_capacity != &local_408) {
LAB_0013bce3:
              operator_delete((void *)uVar23,(ulong)(uVar32 + 1));
            }
          }
          else {
            piVar15 = __errno_location();
            iVar12 = *piVar15;
            *piVar15 = 0;
            uVar32 = &local_1f8;
            lVar14 = strtol(_Var34._M_p,(char **)uVar32,10);
            if ((pointer)local_1f8._M_allocated_capacity == _Var34._M_p) goto LAB_0013c2ae;
            uVar35 = (uint)lVar14;
            if (((int)uVar35 != lVar14) || (*piVar15 == 0x22)) goto LAB_0013c2ba;
            if (*piVar15 == 0) {
              *piVar15 = iVar12;
            }
            uVar11 = -uVar35;
            if (0 < (int)uVar35) {
              uVar11 = uVar35;
            }
            uVar30 = 1;
            if (9 < uVar11) {
              uVar29 = (ulong)uVar11;
              uVar2 = 4;
              do {
                uVar30 = uVar2;
                uVar24 = (uint)uVar29;
                if (uVar24 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_0013bbe6;
                }
                if (uVar24 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_0013bbe6;
                }
                if (uVar24 < 10000) goto LAB_0013bbe6;
                uVar29 = uVar29 / 10000;
                uVar2 = uVar30 + 4;
              } while (99999 < uVar24);
              uVar30 = uVar30 + 1;
            }
LAB_0013bbe6:
            local_3c0._M_allocated_capacity = (size_type)&local_3b0;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_3c0,(char)uVar30 - ((char)((ulong)lVar14 >> 0x18) >> 7));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_3c0._M_allocated_capacity + (uVar35 >> 0x1f)),uVar30,uVar11);
            puVar18 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,0x1449dd);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar25) {
              local_408._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_408._8_8_ = puVar18[3];
              local_418._M_allocated_capacity = (size_type)&local_408;
            }
            else {
              local_408._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_418._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar18;
            }
            local_418._8_8_ = puVar18[1];
            *puVar18 = paVar25;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_418);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_allocated_capacity != &local_408) {
              operator_delete((void *)local_418._M_allocated_capacity,
                              (ulong)(local_408._M_allocated_capacity + 1));
            }
            psVar31 = local_420;
            uVar32 = local_3b0._M_allocated_capacity;
            uVar23 = local_3c0._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_allocated_capacity != &local_3b0) goto LAB_0013bce3;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
LAB_0013bd13:
            operator_delete((void *)local_398._M_allocated_capacity,
                            (ulong)(local_388._M_allocated_capacity + 1));
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[14]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
        if (local_3cc == LOCAL_VAR) {
          uVar11 = function::getOffSet(fn,psVar31);
          uVar35 = -uVar11;
          if (0 < (int)uVar11) {
            uVar35 = uVar11;
          }
          uVar30 = 1;
          if (9 < uVar35) {
            uVar29 = (ulong)uVar35;
            uVar2 = 4;
            do {
              uVar30 = uVar2;
              uVar24 = (uint)uVar29;
              if (uVar24 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0013bf84;
              }
              if (uVar24 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0013bf84;
              }
              if (uVar24 < 10000) goto LAB_0013bf84;
              uVar29 = uVar29 / 10000;
              uVar2 = uVar30 + 4;
            } while (99999 < uVar24);
            uVar30 = uVar30 + 1;
          }
LAB_0013bf84:
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_480,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_480._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,0x14497c);
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar25) {
            local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_388._8_8_ = puVar18[3];
            local_398._M_allocated_capacity = (size_type)&local_388;
          }
          else {
            local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_398._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar18;
          }
          local_398._8_8_ = puVar18[1];
          *puVar18 = paVar25;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            (ulong)(local_388._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_398._M_local_buf);
          pcVar1 = (psVar31->_M_dataplus)._M_p;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_480,pcVar1,pcVar1 + psVar31->_M_string_length);
          sVar36 = local_480._M_string_length;
          _Var34._M_p = local_480._M_dataplus._M_p;
          if (local_480._M_string_length != 0) {
            sVar37 = 0;
            do {
              iVar12 = tolower((int)_Var34._M_p[sVar37]);
              _Var34._M_p[sVar37] = (char)iVar12;
              sVar37 = sVar37 + 1;
            } while (sVar36 != sVar37);
          }
          pmVar19 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,&local_480);
          iVar12 = *pmVar19;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_388._M_local_buf,"0x",2);
          *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
               *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
               0xffffffb5 | 8;
          std::ostream::operator<<((ostream *)local_388._M_local_buf,iVar12);
          std::__cxx11::stringbuf::str();
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,0x14497c);
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar25) {
            local_408._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_408._8_8_ = puVar18[3];
            local_418._M_allocated_capacity = (size_type)&local_408;
          }
          else {
            local_408._M_allocated_capacity = paVar25->_M_allocated_capacity;
            local_418._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar18;
          }
          local_418._8_8_ = puVar18[1];
          *puVar18 = paVar25;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_418
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_allocated_capacity != &local_408) {
            operator_delete((void *)local_418._M_allocated_capacity,
                            (ulong)(local_408._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_allocated_capacity != &local_3b0) {
            operator_delete((void *)local_3c0._M_allocated_capacity,
                            (ulong)(local_3b0._M_allocated_capacity + 1));
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_398._M_local_buf);
          std::ios_base::~ios_base(local_318);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
        local_398._M_allocated_capacity._0_4_ = 0x19;
        pmVar21 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&local_398._M_allocated_capacity);
        (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
        pcVar1 = (pmVar21->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,pcVar1,pcVar1 + pmVar21->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
        goto LAB_0013c11e;
      }
      local_3c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fn;
      piVar15 = __errno_location();
      iVar12 = *piVar15;
      *piVar15 = 0;
      lVar14 = strtol(paVar25->_M_local_buf,(char **)&local_398._M_allocated_capacity,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity != paVar25) {
        iVar10 = (int)lVar14;
        if ((iVar10 != lVar14) || (*piVar15 == 0x22)) goto LAB_0013c216;
        if (*piVar15 == 0) {
          *piVar15 = iVar12;
        }
        if (local_210.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_210.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        pcVar1 = ((local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_460,pcVar1,
                   pcVar1 + (local_210.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        paVar25 = local_3c8;
        getRealName(&local_3f8,&local_460,'[');
        vVar6 = whatIsThisShit(&local_3f8,(function *)paVar25);
        if (vVar6 == TEMP_VAR) {
          bVar3 = function::varHasReg((function *)paVar25,&local_460);
          if (bVar3) {
            RVar7 = function::getRegOfVar((function *)paVar25,&local_460,true);
            local_418._M_allocated_capacity._0_4_ = RVar7;
            pmVar21 = std::
                      map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::at(&reg2str_abi_cxx11_,(key_type *)&local_418._M_allocated_capacity);
            std::operator+(&local_440,"mul $t8 ",pmVar21);
            puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar25) {
              local_4a0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_4a0.field_2._8_8_ = puVar18[3];
              local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
            }
            else {
              local_4a0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_4a0._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_4a0._M_string_length = puVar18[1];
            *puVar18 = paVar25;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            iVar12 = Identifier::getDimension(var,2);
            std::__cxx11::to_string(&local_480,iVar12 << 2);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,&local_4a0,&local_480);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity != &local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,
                              (ulong)(local_388._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
              operator_delete(local_4a0._M_dataplus._M_p,
                              (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
            }
            uVar32 = local_440.field_2._0_8_;
            uVar23 = local_440._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
LAB_00139d0b:
              operator_delete((void *)uVar23,(ulong)(uVar32 + 1));
            }
          }
          else {
            iVar12 = function::getOffsetOfTemp((function *)paVar25,&local_460,true);
            std::__cxx11::to_string(&local_440,iVar12);
            std::operator+(&local_4a0,"lw $t8 ",&local_440);
            puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar25) {
              local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_388._8_8_ = puVar18[3];
              local_398._M_allocated_capacity = (size_type)&local_388;
            }
            else {
              local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_398._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar18;
            }
            local_398._8_8_ = puVar18[1];
            *puVar18 = paVar25;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity != &local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,
                              (ulong)(local_388._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
              operator_delete(local_4a0._M_dataplus._M_p,
                              (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
            }
            iVar12 = Identifier::getDimension(var,2);
            std::__cxx11::to_string(&local_4a0,iVar12 << 2);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,"mul $t8 $t8 ",&local_4a0);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity != &local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,
                              (ulong)(local_388._M_allocated_capacity + 1));
            }
            uVar32 = local_4a0.field_2._M_allocated_capacity;
            uVar23 = local_4a0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) goto LAB_00139d0b;
          }
        }
        else {
          getValueOfVar((string *)&local_398,&local_460,(function *)paVar25);
          vVar6 = whatIsThisShit((string *)&local_398,(function *)paVar25);
          if (vVar6 == TEMP_VAR) {
            std::operator+(&local_480,"mul $t8 ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398);
            puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_480);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar25) {
              local_440.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_440.field_2._8_8_ = puVar18[3];
              local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
            }
            else {
              local_440.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              local_440._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_440._M_string_length = puVar18[1];
            *puVar18 = paVar25;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            iVar12 = Identifier::getDimension(var,2);
            std::__cxx11::to_string((string *)&local_418,iVar12 << 2);
            std::operator+(&local_4a0,&local_440,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_418);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&local_4a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
              operator_delete(local_4a0._M_dataplus._M_p,
                              (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_allocated_capacity != &local_408) {
              operator_delete((void *)local_418._M_allocated_capacity,
                              (ulong)(local_408._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
            }
            uVar32 = local_480.field_2._0_8_;
            _Var34._M_p = local_480._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
LAB_00139a0c:
              operator_delete(_Var34._M_p,(ulong)(uVar32 + 1));
            }
          }
          else {
            iVar12 = std::__cxx11::stoi((string *)&local_398,(size_t *)0x0,10);
            iVar13 = Identifier::getDimension(var,2);
            std::__cxx11::to_string(&local_440,iVar12 * iVar13 * 4);
            std::operator+(&local_4a0,"li $t8 ",&local_440);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&local_4a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
              operator_delete(local_4a0._M_dataplus._M_p,
                              (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
            }
            uVar32 = local_440.field_2._0_8_;
            _Var34._M_p = local_440._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) goto LAB_00139a0c;
          }
          uVar32 = local_388._M_allocated_capacity;
          uVar23 = local_398._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) goto LAB_00139d0b;
        }
        uVar11 = iVar10 * 4;
        uVar35 = iVar10 * -4;
        if (iVar10 * -4 < 0) {
          uVar35 = uVar11;
        }
        uVar30 = 1;
        if (9 < uVar35) {
          uVar29 = (ulong)uVar35;
          uVar2 = 4;
          do {
            uVar30 = uVar2;
            uVar24 = (uint)uVar29;
            if (uVar24 < 100) {
              uVar30 = uVar30 - 2;
              goto LAB_00139d72;
            }
            if (uVar24 < 1000) {
              uVar30 = uVar30 - 1;
              goto LAB_00139d72;
            }
            if (uVar24 < 10000) goto LAB_00139d72;
            uVar29 = uVar29 / 10000;
            uVar2 = uVar30 + 4;
          } while (99999 < uVar24);
          uVar30 = uVar30 + 1;
        }
LAB_00139d72:
        paVar25 = &local_4a0.field_2;
        local_4a0._M_dataplus._M_p = (pointer)paVar25;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_4a0,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_4a0._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,0x1449dd);
        paVar26 = local_3c8;
        psVar31 = local_420;
        paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar18 == paVar28) {
          local_388._M_allocated_capacity = paVar28->_M_allocated_capacity;
          local_388._8_8_ = puVar18[3];
          local_398._M_allocated_capacity = (size_type)&local_388;
        }
        else {
          local_388._M_allocated_capacity = paVar28->_M_allocated_capacity;
          local_398._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar18;
        }
        local_398._8_8_ = puVar18[1];
        *puVar18 = paVar28;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) {
          operator_delete((void *)local_398._M_allocated_capacity,
                          (ulong)(local_388._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != paVar25) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
        if (local_3cc == LOCAL_VAR) {
          uVar11 = function::getOffSet((function *)paVar26,psVar31);
          uVar35 = -uVar11;
          if (0 < (int)uVar11) {
            uVar35 = uVar11;
          }
          uVar30 = 1;
          if (9 < uVar35) {
            uVar29 = (ulong)uVar35;
            uVar2 = 4;
            do {
              uVar30 = uVar2;
              uVar24 = (uint)uVar29;
              if (uVar24 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0013ae66;
              }
              if (uVar24 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0013ae66;
              }
              if (uVar24 < 10000) goto LAB_0013ae66;
              uVar29 = uVar29 / 10000;
              uVar2 = uVar30 + 4;
            } while (99999 < uVar24);
            uVar30 = uVar30 + 1;
          }
LAB_0013ae66:
          local_4a0._M_dataplus._M_p = (pointer)paVar25;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_4a0,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_4a0._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,0x14497c);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar26) {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_388._8_8_ = puVar18[3];
            local_398._M_allocated_capacity = (size_type)&local_388;
          }
          else {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_398._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar18;
          }
          local_398._8_8_ = puVar18[1];
          *puVar18 = paVar26;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            (ulong)(local_388._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != paVar25) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_398._M_local_buf);
          pcVar1 = (psVar31->_M_dataplus)._M_p;
          local_4a0._M_dataplus._M_p = (pointer)paVar25;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4a0,pcVar1,pcVar1 + psVar31->_M_string_length);
          sVar36 = local_4a0._M_string_length;
          _Var34._M_p = local_4a0._M_dataplus._M_p;
          if (local_4a0._M_string_length != 0) {
            sVar37 = 0;
            do {
              iVar12 = tolower((int)_Var34._M_p[sVar37]);
              _Var34._M_p[sVar37] = (char)iVar12;
              sVar37 = sVar37 + 1;
            } while (sVar36 != sVar37);
          }
          pmVar19 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,&local_4a0);
          iVar12 = *pmVar19;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_388._M_local_buf,"0x",2);
          *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
               *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
               0xffffffb5 | 8;
          std::ostream::operator<<((ostream *)local_388._M_local_buf,iVar12);
          std::__cxx11::stringbuf::str();
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,0x14497c);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar26) {
            local_440.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_440.field_2._8_8_ = puVar18[3];
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          }
          else {
            local_440.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_440._M_dataplus._M_p = (pointer)*puVar18;
          }
          local_440._M_string_length = puVar18[1];
          *puVar18 = paVar26;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&local_440);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != paVar25) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_398._M_local_buf);
          std::ios_base::~ios_base(local_318);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[13]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
        local_398._M_allocated_capacity._0_4_ = 0x19;
        pmVar21 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&local_398._M_allocated_capacity);
        (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
        pcVar1 = (pmVar21->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3d8,pcVar1,pcVar1 + pmVar21->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p == &local_460.field_2) goto LAB_0013c14f;
        goto LAB_0013c142;
      }
      goto LAB_0013c1df;
    }
    if (uVar29 < 2) {
LAB_0013c1af:
      uVar32 = 1;
LAB_0013c1b4:
      std::__throw_out_of_range_fmt(pcVar33,uVar32,uVar29);
    }
    local_3c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fn;
    if (local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) goto LAB_0013c1a7;
    cVar4 = *local_210.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar15 = __errno_location();
    if ((int)cVar4 - 0x30U < 10) {
      iVar12 = *piVar15;
      *piVar15 = 0;
      local_3a0 = var;
      lVar14 = strtol(paVar25->_M_local_buf,(char **)&local_398._M_allocated_capacity,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity != paVar25) {
        if (((int)lVar14 == lVar14) && (iVar10 = *piVar15, iVar10 != 0x22)) {
          if (iVar10 == 0) {
            *piVar15 = iVar12;
            iVar10 = iVar12;
          }
          if ((ulong)((long)local_210.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_210.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_0013c22e;
          uVar32 = local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          *piVar15 = 0;
          fn = (function *)&local_398;
          lVar16 = strtol((char *)uVar32,(char **)fn,10);
          if (local_398._M_allocated_capacity == uVar32) {
            std::__throw_invalid_argument("stoi");
          }
          else if ((0xfffffffeffffffff < lVar16 - 0x80000000U) && (*piVar15 != 0x22)) {
            if (*piVar15 == 0) {
              *piVar15 = iVar10;
            }
            iVar12 = Identifier::getDimension(local_3a0,2);
            uVar11 = iVar12 * (int)lVar14 + (int)lVar16;
            uVar35 = -uVar11;
            if (0 < (int)uVar11) {
              uVar35 = uVar11;
            }
            uVar30 = 1;
            if (9 < uVar35) {
              uVar29 = (ulong)uVar35;
              uVar2 = 4;
              do {
                uVar30 = uVar2;
                uVar24 = (uint)uVar29;
                if (uVar24 < 100) {
                  uVar30 = uVar30 - 2;
                  goto LAB_00139443;
                }
                if (uVar24 < 1000) {
                  uVar30 = uVar30 - 1;
                  goto LAB_00139443;
                }
                if (uVar24 < 10000) goto LAB_00139443;
                uVar29 = uVar29 / 10000;
                uVar2 = uVar30 + 4;
              } while (99999 < uVar24);
              uVar30 = uVar30 + 1;
            }
LAB_00139443:
            paVar25 = &local_460.field_2;
            local_460._M_dataplus._M_p = (pointer)paVar25;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_460,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_460._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
            puVar18 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,0x144966);
            psVar31 = local_420;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 == paVar26) {
              local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_388._8_8_ = puVar18[3];
              local_398._M_allocated_capacity = (size_type)&local_388;
            }
            else {
              local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_398._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar18;
            }
            local_398._8_8_ = puVar18[1];
            *puVar18 = paVar26;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_allocated_capacity != &local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,
                              (ulong)(local_388._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_460._M_dataplus._M_p != paVar25) {
              operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1
                             );
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[14]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
            if (local_3cc == LOCAL_VAR) {
              uVar11 = function::getOffSet((function *)local_3c8,psVar31);
              uVar35 = -uVar11;
              if (0 < (int)uVar11) {
                uVar35 = uVar11;
              }
              uVar30 = 1;
              if (9 < uVar35) {
                uVar29 = (ulong)uVar35;
                uVar2 = 4;
                do {
                  uVar30 = uVar2;
                  uVar24 = (uint)uVar29;
                  if (uVar24 < 100) {
                    uVar30 = uVar30 - 2;
                    goto LAB_0013abad;
                  }
                  if (uVar24 < 1000) {
                    uVar30 = uVar30 - 1;
                    goto LAB_0013abad;
                  }
                  if (uVar24 < 10000) goto LAB_0013abad;
                  uVar29 = uVar29 / 10000;
                  uVar2 = uVar30 + 4;
                } while (99999 < uVar24);
                uVar30 = uVar30 + 1;
              }
LAB_0013abad:
              local_460._M_dataplus._M_p = (pointer)paVar25;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_460,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_460._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
              puVar18 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,0x14497c);
              paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar18 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar18 == paVar26) {
                local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
                local_388._8_8_ = puVar18[3];
                local_398._M_allocated_capacity = (size_type)&local_388;
              }
              else {
                local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
                local_398._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar18;
              }
              local_398._8_8_ = puVar18[1];
              *puVar18 = paVar26;
              puVar18[1] = 0;
              *(undefined1 *)(puVar18 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_398);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_allocated_capacity != &local_388) {
                operator_delete((void *)local_398._M_allocated_capacity,
                                (ulong)(local_388._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p != paVar25) {
                operator_delete(local_460._M_dataplus._M_p,
                                local_460.field_2._M_allocated_capacity + 1);
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[16]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[17]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)local_398._M_local_buf);
              pcVar1 = (psVar31->_M_dataplus)._M_p;
              local_460._M_dataplus._M_p = (pointer)paVar25;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_460,pcVar1,pcVar1 + psVar31->_M_string_length);
              _Var34._M_p = local_460._M_dataplus._M_p;
              if (local_460._M_string_length != 0) {
                sVar36 = 0;
                do {
                  iVar12 = tolower((int)_Var34._M_p[sVar36]);
                  _Var34._M_p[sVar36] = (char)iVar12;
                  sVar36 = sVar36 + 1;
                } while (local_460._M_string_length != sVar36);
              }
              pmVar19 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::at(&var2mem_abi_cxx11_,&local_460);
              iVar12 = *pmVar19;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_388._M_local_buf,"0x",2);
              *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
                   *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18))
                   & 0xffffffb5 | 8;
              std::ostream::operator<<((ostream *)local_388._M_local_buf,iVar12);
              std::__cxx11::stringbuf::str();
              plVar20 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_4a0,0,(char *)0x0,0x14497c);
              paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar20 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar20 == paVar26) {
                local_3f8.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
                local_3f8.field_2._8_8_ = plVar20[3];
                local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
              }
              else {
                local_3f8.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
                local_3f8._M_dataplus._M_p = (pointer)*plVar20;
              }
              local_3f8._M_string_length = plVar20[1];
              *plVar20 = (long)paVar26;
              plVar20[1] = 0;
              *(undefined1 *)(plVar20 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,&local_3f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                operator_delete(local_4a0._M_dataplus._M_p,
                                (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[17]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p != paVar25) {
                operator_delete(local_460._M_dataplus._M_p,
                                local_460.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_398._M_local_buf);
              std::ios_base::~ios_base(local_318);
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[13]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
            local_398._M_allocated_capacity._0_4_ = 0x19;
            pmVar21 = std::
                      map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::at(&reg2str_abi_cxx11_,(key_type *)&local_398._M_allocated_capacity);
            (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
            pcVar1 = (pmVar21->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3d8,pcVar1,pcVar1 + pmVar21->_M_string_length);
            goto LAB_0013c14f;
          }
          std::__throw_out_of_range("stoi");
          goto LAB_0013c27e;
        }
        std::__throw_out_of_range("stoi");
LAB_0013c216:
        std::__throw_out_of_range("stoi");
LAB_0013c222:
        std::__throw_out_of_range("stoi");
LAB_0013c22e:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
      }
      goto LAB_0013c1d3;
    }
    iVar12 = *piVar15;
    *piVar15 = 0;
    lVar14 = strtol(paVar25->_M_local_buf,(char **)&local_398._M_allocated_capacity,10);
    psVar31 = local_420;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_allocated_capacity != paVar25) {
      iVar10 = (int)lVar14;
      if ((iVar10 != lVar14) || (*piVar15 == 0x22)) goto LAB_0013c222;
      if (*piVar15 == 0) {
        *piVar15 = iVar12;
      }
      if ((ulong)((long)local_210.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_210.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
      }
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      pcVar1 = local_210.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_460,pcVar1,
                 pcVar1 + local_210.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
      paVar25 = local_3c8;
      getRealName(&local_3f8,&local_460,'[');
      vVar6 = whatIsThisShit(&local_3f8,(function *)paVar25);
      if (vVar6 == TEMP_VAR) {
        bVar3 = function::varHasReg((function *)paVar25,&local_460);
        if (bVar3) {
          RVar7 = function::getRegOfVar((function *)paVar25,&local_460,true);
          local_440._M_dataplus._M_p._0_4_ = RVar7;
          pmVar21 = std::
                    map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at(&reg2str_abi_cxx11_,(key_type *)&local_440);
          std::operator+(&local_4a0,"sll $t8 ",pmVar21);
          puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar26) {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_388._8_8_ = puVar18[3];
            local_398._M_allocated_capacity = (size_type)&local_388;
          }
          else {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_398._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar18;
          }
          local_398._8_8_ = puVar18[1];
          *puVar18 = paVar26;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            (ulong)(local_388._M_allocated_capacity + 1));
          }
          uVar32 = local_4a0.field_2._M_allocated_capacity;
          uVar23 = local_4a0._M_dataplus._M_p;
          psVar31 = local_420;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) goto LAB_00139c04;
        }
        else {
          iVar12 = function::getOffsetOfTemp((function *)paVar25,&local_460,true);
          std::__cxx11::to_string(&local_440,iVar12);
          std::operator+(&local_4a0,"lw $t8 ",&local_440);
          puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar26) {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_388._8_8_ = puVar18[3];
            local_398._M_allocated_capacity = (size_type)&local_388;
          }
          else {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_398._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar18;
          }
          local_398._8_8_ = puVar18[1];
          *puVar18 = paVar26;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            (ulong)(local_388._M_allocated_capacity + 1));
          }
          psVar31 = local_420;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[14]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
        }
      }
      else {
        getValueOfVar((string *)&local_398,&local_460,(function *)paVar25);
        vVar6 = whatIsThisShit((string *)&local_398,(function *)paVar25);
        if (vVar6 == TEMP_VAR) {
          std::operator+(&local_440,"sll $t8 ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_398);
          puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar26) {
            local_4a0.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_4a0.field_2._8_8_ = puVar18[3];
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          }
          else {
            local_4a0.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_4a0._M_dataplus._M_p = (pointer)*puVar18;
          }
          local_4a0._M_string_length = puVar18[1];
          *puVar18 = paVar26;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&local_4a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          psVar31 = local_420;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
LAB_00139a92:
            operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
          }
        }
        else {
          iVar12 = std::__cxx11::stoi((string *)&local_398,(size_t *)0x0,10);
          std::__cxx11::to_string(&local_440,iVar12 << 2);
          std::operator+(&local_4a0,"li $t8 ",&local_440);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&local_4a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) goto LAB_00139a92;
        }
        uVar32 = local_388._M_allocated_capacity;
        uVar23 = local_398._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) {
LAB_00139c04:
          operator_delete((void *)uVar23,(ulong)(uVar32 + 1));
        }
      }
      if (local_3cc == LOCAL_VAR) {
        iVar12 = function::getOffSet((function *)paVar25,psVar31);
        iVar13 = Identifier::getDimension(var,2);
        uVar11 = iVar12 + iVar13 * iVar10 * -4;
        uVar35 = -uVar11;
        if (0 < (int)uVar11) {
          uVar35 = uVar11;
        }
        uVar30 = 1;
        if (9 < uVar35) {
          uVar29 = (ulong)uVar35;
          uVar2 = 4;
          do {
            uVar30 = uVar2;
            uVar24 = (uint)uVar29;
            if (uVar24 < 100) {
              uVar30 = uVar30 - 2;
              goto LAB_0013acff;
            }
            if (uVar24 < 1000) {
              uVar30 = uVar30 - 1;
              goto LAB_0013acff;
            }
            if (uVar24 < 10000) goto LAB_0013acff;
            uVar29 = uVar29 / 10000;
            uVar2 = uVar30 + 4;
          } while (99999 < uVar24);
          uVar30 = uVar30 + 1;
        }
LAB_0013acff:
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_4a0,(char)uVar30 - (char)((int)uVar11 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_4a0._M_dataplus._M_p + (uVar11 >> 0x1f),uVar30,uVar35);
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,0x14497c);
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar18 == paVar25) {
          local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_388._8_8_ = puVar18[3];
          local_398._M_allocated_capacity = (size_type)&local_388;
        }
        else {
          local_388._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_398._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar18;
        }
        local_398._8_8_ = puVar18[1];
        *puVar18 = paVar25;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) {
          operator_delete((void *)local_398._M_allocated_capacity,
                          (ulong)(local_388._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)local_398._M_local_buf);
        pcVar1 = (psVar31->_M_dataplus)._M_p;
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4a0,pcVar1,pcVar1 + psVar31->_M_string_length);
        sVar36 = local_4a0._M_string_length;
        _Var34._M_p = local_4a0._M_dataplus._M_p;
        if (local_4a0._M_string_length != 0) {
          sVar37 = 0;
          do {
            iVar12 = tolower((int)_Var34._M_p[sVar37]);
            _Var34._M_p[sVar37] = (char)iVar12;
            sVar37 = sVar37 + 1;
          } while (sVar36 != sVar37);
        }
        pmVar19 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(&var2mem_abi_cxx11_,&local_4a0);
        iVar12 = *pmVar19;
        iVar13 = Identifier::getDimension(var,2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_388._M_local_buf,"0x",2)
        ;
        *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
             0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)local_388._M_local_buf,iVar12 + iVar13 * iVar10 * 4);
        std::__cxx11::stringbuf::str();
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,0x14497c);
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar18 == paVar25) {
          local_440.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_440.field_2._8_8_ = puVar18[3];
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        }
        else {
          local_440.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
          local_440._M_dataplus._M_p = (pointer)*puVar18;
        }
        local_440._M_string_length = puVar18[1];
        *puVar18 = paVar25;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&local_440);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,(ulong)(local_440.field_2._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p,(ulong)(local_480.field_2._0_8_ + 1));
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_398._M_local_buf);
        std::ios_base::~ios_base(local_318);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[13]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
      local_398._M_allocated_capacity._0_4_ = 0x19;
      pmVar21 = std::
                map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::at(&reg2str_abi_cxx11_,(key_type *)&local_398._M_allocated_capacity);
      (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
      pcVar1 = (pmVar21->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3d8,pcVar1,pcVar1 + pmVar21->_M_string_length);
      goto LAB_0013c11e;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0013c1f7:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
}

Assistant:

string getValueOfVarIml(function &fn, string &varName, string &varName1, Identifier var, enum varType type) {
    stringstream stream;
    if (varName.find('[') == string::npos) {//普通标识符
        if (var.initialized && var.getIdCategory() == CONST) {//是否是初始化变量
            if (var.getTokenCategory() == CHARTK) {
                stream << var.getCharValue(0);
                return "\'" + stream.str() + "\'";
            } else {
                stream << var.getIntValue(0);
                return stream.str();
            }
        } else {
            string name = varName1;
            transform(name.begin(), name.end(), name.begin(), ::tolower);
            if (fn.varHasReg(varName1)) {//寄存器中存在
                return reg2str.at(fn.getRegOfVar(varName1, true));
            } else if (fn.stackHasVar(varName1) || var2mem.count(name) != 0) {//堆或栈中存在
                int offset;
                if (fn.stackHasVar(varName1)) {
                    offset = fn.getOffSet(varName1);
                    mipsCode.emplace_back("lw $t9 " + to_string(offset) + "($sp)");
                } else {
                    stringstream stream2;
                    string name0 = varName;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    offset = var2mem.at(name0);
                    stream2 << "0x" << hex << offset;
                    mipsCode.emplace_back("lw $t9 " + stream2.str());
                }
                return reg2str.at($t9);
            } else {//分配
                variableArrangeSpace(fn, varName1, whatIsThisShit(varName1, fn));
                if (fn.varHasReg(varName1))
                    return reg2str.at(fn.getRegOfVar(varName1, false));
                else {
                    mipsCode.emplace_back("lw $t9 " + to_string(fn.getOffSet(varName1)) + "($sp)");
                    return reg2str.at($t9);
                }
            }
        }
    } else {
        vector<string> elements = boomVec(varName);
        if (elements.size() == 1) {//一维数组
            if (isdigit(elements.at(0).at(0))) {//数字下标
                int d1 = stoi(elements.at(0));
                mipsCode.emplace_back("li $t8 " + to_string(d1));
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else {//变量下标
                string index = elements.at(0);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("sll $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " 2");
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("sll $t8 $t8 2");
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("sll $t8 " + vn + " 2");
                    else//变量转数字
                        mipsCode.emplace_back("li $t8 " + to_string(stoi(vn) * 4));
                }
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            }
        } else {//二维数组
            if (isdigit(elements.at(0).at(0))
                && isdigit(elements.at(1).at(0))) {//两个都是数字下标
                int d1 = stoi(elements.at(0));
                int d2 = stoi(elements.at(1));
                int index = d1 * var.getDimension(2) + d2;
                mipsCode.emplace_back("li $t8 " + to_string(index));
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else if (isdigit(elements.at(0).at(0))
                       && !isdigit(elements.at(1).at(0))) {//第一维是数字下标，第二维不是
                int d1 = stoi(elements.at(0));
                string index = elements.at(1);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("sll $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " 2");
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("sll $t8 $t8 2");
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("sll $t8 " + vn + " 2");
                    else
                        mipsCode.emplace_back("li $t8 " + to_string(stoi(vn) * 4));
                }
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1) - d1 * var.getDimension(2) * 4;
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0) + d1 * var.getDimension(2) * 4;
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else if (!isdigit(elements.at(0).at(0))
                       && isdigit(elements.at(1).at(0))) {//第一维不是数字下标，第二维是
                int d2 = stoi(elements.at(1)) * 4;
                string index = elements.at(0);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("mul $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " " +
                                              to_string(var.getDimension(2) * 4));
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("mul $t8 $t8 " + to_string(var.getDimension(2) * 4));
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("mul $t8 " + vn + " " +
                                              to_string(var.getDimension(2) * 4));
                    else
                        mipsCode.emplace_back(
                                "li $t8 " + to_string(stoi(vn) * var.getDimension(2) * 4));
                }
                mipsCode.emplace_back("addi $t8 $t8 " + to_string(d2));
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else {//第一维和第二维都不是数字下标
                string index1 = elements.at(0);
                string index2 = elements.at(1);
                string realName1 = getRealName(index1, '[');
                string realName2 = getRealName(index2, '[');
                varType ty1 = whatIsThisShit(realName1, fn);
                varType ty2 = whatIsThisShit(realName2, fn);
                if (ty1 == TEMP_VAR) {
                    if (fn.varHasReg(index1))
                        mipsCode.emplace_back("mul $t8 " +
                                              reg2str.at(fn.getRegOfVar(index1, true)) + " " +
                                              to_string(var.getDimension(2)));
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index1, true)) + "($sp)");
                        mipsCode.emplace_back("mul $t8 $t8 " + to_string(var.getDimension(2)));
                    }
                } else {
                    string vn = getValueOfVar(index1, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("mul $t8 " + vn + " " +
                                              to_string(var.getDimension(2)));
                    else
                        mipsCode.emplace_back(
                                "li $t8 " + to_string(stoi(vn) * var.getDimension(2)));
                }
                if (ty2 == TEMP_VAR) {
                    if (fn.varHasReg(index2))
                        mipsCode.emplace_back("addu $t8 $t8 " + reg2str.at(fn.getRegOfVar(index2, true)));
                    else {
                        mipsCode.emplace_back("lw $t9 " + to_string(fn.getOffsetOfTemp(index2, true)) + "($sp)");
                        mipsCode.emplace_back("addu $t8 $t8 $t9");
                    }
                } else {
                    string choose;
                    if (!v1) {
                        mipsCode.emplace_back("la $v1 ($t8)");
                        choose = "v1";
                        v1 = true;
                    } else {
                        mipsCode.emplace_back("la $s7 ($t8)");
                        choose = "s7";
                        s7 = true;
                    }
                    string vn = getValueOfVar(index2, fn);
                    if (choose == "v1") {
                        mipsCode.emplace_back("la $t8 ($v1)");
                        v1 = false;
                    } else {
                        mipsCode.emplace_back("la $t8 ($s7)");
                        s7 = false;
                    }
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("addu $t8 $t8 " + vn);
                    else
                        mipsCode.emplace_back("addi $t8 $t8 " + to_string(stoi(vn)));
                }
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            }
        }
    }
}